

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O1

void __thiscall
assembler::VirtualChannel::process
          (VirtualChannel *this,
          unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *tpdu,
          vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
          *out)

{
  _Rb_tree_header *p_Var1;
  TransportPDU *pTVar2;
  byte *pbVar3;
  long lVar4;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *out_00;
  bool bVar5;
  int iVar6;
  uint *puVar7;
  ostream *poVar8;
  mapped_type_conflict1 *pmVar9;
  SessionPDU *pSVar10;
  runtime_error *this_00;
  _Base_ptr p_Var11;
  uint apid;
  byte bVar12;
  uint b;
  _Base_ptr p_Var13;
  _Rb_tree<int,std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>>
  *p_Var14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int *in_R9;
  pointer *__ptr;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  pVar16;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>
  pVar17;
  __single_object spdu;
  _Head_base<0UL,_assembler::SessionPDU_*,_false> local_90;
  _Rb_tree<int,std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>>
  *local_88;
  __uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> local_80;
  __uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> local_78;
  _Head_base<0UL,_assembler::SessionPDU_*,_false> local_70;
  __uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> local_68;
  undefined1 local_60 [8];
  _Head_base<0UL,_assembler::SessionPDU_*,_false> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *local_40;
  uint local_34;
  
  pTVar2 = (tpdu->_M_t).
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
  pbVar3 = *(byte **)&(pTVar2->header).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  apid = (uint)pbVar3[1] | (*pbVar3 & 7) << 8;
  if (apid == 0x7ff) {
    return;
  }
  bVar5 = TransportPDU::verifyCRC(pTVar2);
  local_60._0_4_ = apid;
  if (bVar5) {
    lVar4 = *(long *)&(((tpdu->_M_t).
                        super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                        .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl)->
                      header).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
    p_Var1 = &(this->apidSeq_)._M_t._M_impl.super__Rb_tree_header;
    p_Var13 = (this->apidSeq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var11 = &p_Var1->_M_header;
    for (; p_Var13 != (_Base_ptr)0x0;
        p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < (int)apid]) {
      if ((int)apid <= (int)p_Var13[1]._M_color) {
        p_Var11 = p_Var13;
      }
    }
    p_Var13 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (p_Var13 = p_Var11, (int)apid < (int)p_Var11[1]._M_color)) {
      p_Var13 = &p_Var1->_M_header;
    }
    b = (*(byte *)(lVar4 + 2) & 0x3f) << 8 | (uint)*(byte *)(lVar4 + 3);
    p_Var14 = (_Rb_tree<int,std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>>
               *)&this->apidSeq_;
    local_40 = out;
    if ((_Rb_tree_header *)p_Var13 != p_Var1) {
      local_88 = p_Var14;
      puVar7 = (uint *)std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)p_Var14,(key_type *)local_60);
      iVar6 = diffWithWrap<16384u>(*puVar7,b);
      p_Var14 = local_88;
      if (1 < iVar6) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": Detected TP_PDU drop",0x16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," (skipped ",10);
        out = local_40;
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar6 + -1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," packet(s)",10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," on APID ",9);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"; prev: ",8);
        local_60._0_4_ = apid;
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)local_88,(key_type *)local_60);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,*pmVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", packet: ",10);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        p_Var14 = local_88;
      }
    }
    local_60._0_4_ = apid;
    puVar7 = (uint *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)p_Var14,(key_type *)local_60);
    *puVar7 = b;
    pTVar2 = (tpdu->_M_t).
             super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
             .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
    bVar12 = *(byte *)(*(long *)&(pTVar2->header).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> +
                      2) >> 6;
    if ((bVar12 | 2) == 3) {
      p_Var1 = &(this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header;
      p_Var13 = (this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      for (; p_Var13 != (_Base_ptr)0x0;
          p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < (int)apid]) {
        if ((int)apid <= (int)p_Var13[1]._M_color) {
          p_Var11 = p_Var13;
        }
      }
      p_Var13 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         (p_Var13 = p_Var11, (int)apid < (int)p_Var11[1]._M_color)) {
        p_Var13 = &p_Var1->_M_header;
      }
      local_88 = (_Rb_tree<int,std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>>
                  *)&this->apidSessionPDU_;
      if ((_Rb_tree_header *)p_Var13 != p_Var1) {
        local_34 = (uint)bVar12;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": New S_PDU for ",0x10);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,", but didn\'t finish previous one",0x20);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        bVar5 = SessionPDU::finish((SessionPDU *)p_Var13[1]._M_parent);
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,": Finished S_PDU for APID ",0x1a);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
          SessionPDU::getName_abi_cxx11_((string *)local_60,(SessionPDU *)p_Var13[1]._M_parent);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)CONCAT44(local_60._4_4_,local_60._0_4_),
                              (long)local_58._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_60._4_4_,local_60._0_4_);
          if (paVar15 != &local_50) {
            operator_delete(paVar15,local_50._M_allocated_capacity + 1);
          }
          local_68._M_t.
          super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
          .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
               (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
               p_Var13[1]._M_parent;
          p_Var13[1]._M_parent = (_Base_ptr)0x0;
          finish((VirtualChannel *)paVar15,
                 (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
                 &local_68,local_40);
          if ((_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
               )local_68._M_t.
                super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl !=
              (SessionPDU *)0x0) {
            std::default_delete<assembler::SessionPDU>::operator()
                      ((default_delete<assembler::SessionPDU> *)&local_68,
                       (SessionPDU *)
                       local_68._M_t.
                       super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                       .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
          }
          local_68._M_t.
          super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
          .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
               (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
               (_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                )0x0;
        }
        p_Var14 = local_88;
        local_60._0_4_ = apid;
        pVar16 = std::
                 _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                 ::equal_range((_Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                                *)local_88,(key_type *)local_60);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
        ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                        *)p_Var14,(_Base_ptr)pVar16.first._M_node,(_Base_ptr)pVar16.second._M_node);
        bVar12 = (byte)local_34;
      }
      pSVar10 = (SessionPDU *)operator_new(0xb0);
      SessionPDU::SessionPDU(pSVar10,this->id_,apid);
      local_90._M_head_impl = pSVar10;
      bVar5 = SessionPDU::append(pSVar10,(tpdu->_M_t).
                                         super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                                         .super__Head_base<0UL,_assembler::TransportPDU_*,_false>.
                                         _M_head_impl);
      if (bVar5) {
        if (bVar12 == 3) {
          if (((local_90._M_head_impl)->buf_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              ((local_90._M_head_impl)->buf_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,": Zero length S_PDU for APID ",0x1d);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::endl<char,std::char_traits<char>>(poVar8);
          }
          else {
            local_70._M_head_impl = local_90._M_head_impl;
            local_90._M_head_impl = (SessionPDU *)0x0;
            finish((VirtualChannel *)pSVar10,
                   (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *
                   )&local_70,local_40);
            if (local_70._M_head_impl != (SessionPDU *)0x0) {
              std::default_delete<assembler::SessionPDU>::operator()
                        ((default_delete<assembler::SessionPDU> *)&local_70,local_70._M_head_impl);
            }
            local_70._M_head_impl = (SessionPDU *)0x0;
          }
        }
        else {
          local_58._M_head_impl = local_90._M_head_impl;
          local_90._M_head_impl = (SessionPDU *)0x0;
          local_60._0_4_ = apid;
          std::
          _Rb_tree<int,std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_int,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>
                    (local_88,(pair<unsigned_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>
                               *)local_60);
          if (local_58._M_head_impl != (SessionPDU *)0x0) {
            std::default_delete<assembler::SessionPDU>::operator()
                      ((default_delete<assembler::SessionPDU> *)&local_58,local_58._M_head_impl);
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,": Invalid first S_PDU for APID ",0x1f);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      if (local_90._M_head_impl == (SessionPDU *)0x0) {
        return;
      }
      std::default_delete<assembler::SessionPDU>::operator()
                ((default_delete<assembler::SessionPDU> *)&local_90,local_90._M_head_impl);
      return;
    }
    if ((bVar12 & 1) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90._M_head_impl._0_4_ = 0xe1;
      util::str<char[46],char[103],char[2],int>
                ((string *)local_60,(util *)"Assertion `flag == 0 || flag == 2` failed at ",
                 (char (*) [46])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/assembler/virtual_channel.cc"
                 ,(char (*) [103])0x1b1e61,(char (*) [2])&local_90,in_R9);
      std::runtime_error::runtime_error(this_00,(string *)local_60);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    p_Var1 = &(this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header;
    p_Var13 = (this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var11 = &p_Var1->_M_header;
    for (; p_Var13 != (_Base_ptr)0x0;
        p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < (int)apid]) {
      if ((int)apid <= (int)p_Var13[1]._M_color) {
        p_Var11 = p_Var13;
      }
    }
    p_Var13 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (p_Var13 = p_Var11, (int)apid < (int)p_Var11[1]._M_color)) {
      p_Var13 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var13 == p_Var1) {
      return;
    }
    pSVar10 = (SessionPDU *)p_Var13[1]._M_parent;
    bVar5 = SessionPDU::append(pSVar10,pTVar2);
    if (bVar5) {
      if (bVar12 != 2) {
        return;
      }
      local_80._M_t.
      super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           p_Var13[1]._M_parent;
      p_Var13[1]._M_parent = (_Base_ptr)0x0;
      finish((VirtualChannel *)pSVar10,
             (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             &local_80,out);
      if ((_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
          local_80._M_t.
          super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
          .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl != (SessionPDU *)0x0)
      {
        std::default_delete<assembler::SessionPDU>::operator()
                  ((default_delete<assembler::SessionPDU> *)&local_80,
                   (SessionPDU *)
                   local_80._M_t.
                   super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                   .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
      }
      local_80._M_t.
      super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           (_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           0x0;
      local_60._0_4_ = apid;
      std::
      map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
      ::erase(&this->apidSessionPDU_,(key_type *)local_60);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,": Unable to append to S_PDU on APID ",0x24);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    bVar5 = SessionPDU::finish((SessionPDU *)p_Var13[1]._M_parent);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": Finished S_PDU for APID ",0x1a);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
      SessionPDU::getName_abi_cxx11_((string *)local_60,(SessionPDU *)p_Var13[1]._M_parent);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)CONCAT44(local_60._4_4_,local_60._0_4_),
                          (long)local_58._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
      std::endl<char,std::char_traits<char>>(poVar8);
      out_00 = local_40;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_60._4_4_,local_60._0_4_);
      if (paVar15 != &local_50) {
        operator_delete(paVar15,local_50._M_allocated_capacity + 1);
      }
      local_78._M_t.
      super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           p_Var13[1]._M_parent;
      p_Var13[1]._M_parent = (_Base_ptr)0x0;
      finish((VirtualChannel *)paVar15,
             (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             &local_78,out_00);
      if ((_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
          local_78._M_t.
          super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
          .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl != (SessionPDU *)0x0)
      {
        std::default_delete<assembler::SessionPDU>::operator()
                  ((default_delete<assembler::SessionPDU> *)&local_78,
                   (SessionPDU *)
                   local_78._M_t.
                   super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                   .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
      }
      local_78._M_t.
      super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           (tuple<assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           (_Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>)
           0x0;
    }
    local_60._0_4_ = apid;
    pVar16 = std::
             _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
             ::equal_range(&(this->apidSessionPDU_)._M_t,(key_type *)local_60);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,": CRC failure; dropping TP_PDU (APID ",0x25);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pVar17 = std::
             _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::equal_range(&(this->apidSeq_)._M_t,(key_type *)local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_M_erase_aux(&(this->apidSeq_)._M_t,(_Base_ptr)pVar17.first._M_node,
                   (_Base_ptr)pVar17.second._M_node);
    local_60._0_4_ = apid;
    pVar16 = std::
             _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
             ::equal_range(&(this->apidSessionPDU_)._M_t,(key_type *)local_60);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  ::_M_erase_aux(&(this->apidSessionPDU_)._M_t,(_Base_ptr)pVar16.first._M_node,
                 (_Base_ptr)pVar16.second._M_node);
  return;
}

Assistant:

void VirtualChannel::process(
    std::unique_ptr<TransportPDU> tpdu,
    std::vector<std::unique_ptr<SessionPDU>>& out) {
  auto apid = tpdu->apid();

  // Ignore fill packets
  if (apid == 2047) {
    return;
  }

  // Verify CRC is correct
  if (!tpdu->verifyCRC()) {
    std::cerr
      << "VC "
      << id_
      << ": CRC failure; dropping TP_PDU (APID " << apid << ")"
      << std::endl;

    // Clear state for this APID.
    apidSeq_.erase(apid);
    apidSessionPDU_.erase(apid);
    return;
  }

  // The sequence counter is described as (section 6.2.1):
  //
  // > 14-bit packet sequence count, straight sequential count (modulo
  // > 16384) that numbers each source packet generated per APID.
  //
  // Sanity check on this counter to protect against drops.
  //
  auto seq = tpdu->sequenceCount();
  if (apidSeq_.count(apid) > 0) {
    auto skip = diffWithWrap<16384>(apidSeq_[apid], seq) - 1;
    if (skip > 0) {
      std::cerr
        << "VC "
        << id_
        << ": Detected TP_PDU drop"
        << " (skipped " << skip << " packet(s)"
        << " on APID " << apid
        << "; prev: " << apidSeq_[apid]
        << ", packet: " << seq
        << ")"
        << std::endl;
    }
  }
  apidSeq_[apid] = seq;

  // Sequence Flag:
  // - Set to 3 if the user data contains one user data file entirely;
  // - Set to 1 if the user data contains the first segment of one user
  //   data file extending through subsequent packets;
  // - Set to 0 if the user data contains a continuation segment of one
  //   user data file still extending through subsequent packets;
  // - Set to 2 if the user data contains the last segment of a user data
  //   file beginning in an earlier packet.
  auto flag = tpdu->sequenceFlag();
  if (flag == 3 || flag == 1) {
    auto it = apidSessionPDU_.find(apid);
    if (it != apidSessionPDU_.end()) {
      std::cerr
        << "VC "
        << id_
        << ": New S_PDU for "
        << apid
        << ", but didn't finish previous one"
        << std::endl;

      // Try to finish pending S_PDU
      auto& spdu = it->second;
      if (spdu->finish()) {
        std::cerr
          << "VC "
          << id_
          << ": Finished S_PDU for APID "
          << apid
          << " (" << spdu->getName() << ")"
          << std::endl;
        finish(std::move(spdu), out);
      }

      // Erase pending S_PDU as it won't be finished now
      apidSessionPDU_.erase(apid);
    }

    auto spdu = std::make_unique<SessionPDU>(id_, apid);
    if (!spdu->append(*tpdu)) {
      std::cerr
        << "VC "
        << id_
        << ": Invalid first S_PDU for APID "
        << apid
        << std::endl;
    } else {
      // Check if this S_PDU is contained in a single TP_PDU
      if (flag == 3) {
        if (spdu->size() == 0) {
          std::cerr
            << "VC "
            << id_
            << ": Zero length S_PDU for APID "
            << apid
            << std::endl;
        } else {
          finish(std::move(spdu), out);
        }
      } else {
        // Expecting subsequent TP_PDUs to fill this S_PDU
        apidSessionPDU_.insert(std::make_pair(apid, std::move(spdu)));
      }
    }
  } else {
    ASSERT(flag == 0 || flag == 2);

    auto it = apidSessionPDU_.find(apid);
    if (it == apidSessionPDU_.end()) {
      // This is not a valid continuation
      if (false) {
        std::cerr
          << "VC "
          << id_
          << ": Expected to have part of S_PDU for APID "
          << apid
          << std::endl;
      }
    } else {
      // Append data from TP_PDU to S_PDU
      auto& spdu = it->second;
      if (!spdu->append(*tpdu)) {
        std::cerr
          << "VC "
          << id_
          << ": Unable to append to S_PDU on APID "
          << apid
          << std::endl;

        // Unable to append; perhaps this continuation belongs
        // to the next S_PDU on this APID and everything in between
        // was dropped. Try to finish at least the previous S_PDU.
        if (spdu->finish()) {
          std::cerr
            << "VC "
            << id_
            << ": Finished S_PDU for APID "
            << apid
            << " (" << spdu->getName() << ")"
            << std::endl;
          finish(std::move(spdu), out);
        }

        // Erase S_PDU regardless if it was finished or not
        apidSessionPDU_.erase(apid);
      } else {
        // Successfully appended TP_PDU to S_PDU
        if (flag == 2) {
          finish(std::move(spdu), out);
          apidSessionPDU_.erase(apid);
        }
      }
    }
  }
}